

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

IndexStorageInfo *
duckdb::GetIndexInfo
          (IndexStorageInfo *__return_storage_ptr__,IndexConstraintType type,bool v1_0_0_storage,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info,
          idx_t id)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  pointer pCVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  idx_t iVar11;
  char cVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> constraint_name;
  undefined1 local_d1;
  undefined8 *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d1 = v1_0_0_storage;
  pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (info);
  pcVar6 = EnumUtil::ToChars<duckdb::IndexConstraintType>(type);
  ::std::__cxx11::string::string((string *)&local_d0,pcVar6,(allocator *)&local_b0);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar7[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_70._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  ::std::operator+(&local_50,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pCVar5 + 1)
                  );
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_a0 = *puVar10;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar10;
    local_b0 = (ulong *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar12 = '\x01';
  if (9 < id) {
    iVar11 = id;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (iVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00a8144e;
      }
      if (iVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00a8144e;
      }
      if (iVar11 < 10000) goto LAB_00a8144e;
      bVar3 = 99999 < iVar11;
      iVar11 = iVar11 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_00a8144e:
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,id);
  uVar2 = CONCAT44(uStack_84,local_88) + local_a8;
  uVar13 = 0xf;
  if (local_b0 != &local_a0) {
    uVar13 = local_a0;
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if (local_90 != local_80) {
      uVar13 = local_80[0];
    }
    if (uVar2 <= uVar13) {
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00a814d1;
    }
  }
  puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_00a814d1:
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar8[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_d0,(undefined1 *)(local_c8 + (long)local_d0));
  (__return_storage_ptr__->options)._M_h._M_buckets =
       &(__return_storage_ptr__->options)._M_h._M_single_bucket;
  (__return_storage_ptr__->options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->root_block_ptr).block_id = -1;
  (__return_storage_ptr__->root_block_ptr).offset = 0;
  (__return_storage_ptr__->root_block_ptr).unused_padding = 0;
  if (!v1_0_0_storage) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[15],bool_const&>
              (&__return_storage_ptr__->options,
               (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)"v1_0_0_storage",&local_d1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexStorageInfo GetIndexInfo(const IndexConstraintType type, const bool v1_0_0_storage, unique_ptr<CreateInfo> &info,
                              const idx_t id) {

	auto &table_info = info->Cast<CreateTableInfo>();
	auto constraint_name = EnumUtil::ToString(type) + "_";
	auto name = constraint_name + table_info.table + "_" + to_string(id);
	IndexStorageInfo index_info(name);
	if (!v1_0_0_storage) {
		index_info.options.emplace("v1_0_0_storage", v1_0_0_storage);
	}
	return index_info;
}